

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O1

ControlTypes __thiscall QLayout::controlTypes(QLayout *this)

{
  int iVar1;
  uint uVar2;
  long *plVar3;
  QFlagsStorage<QSizePolicy::ControlType> QVar4;
  
  iVar1 = (**(code **)(*(long *)this + 200))();
  if (iVar1 == 0) {
    QVar4.i = 1;
  }
  else {
    iVar1 = (**(code **)(*(long *)this + 200))(this);
    if (iVar1 < 1) {
      QVar4.i = 0;
    }
    else {
      iVar1 = iVar1 + 1;
      QVar4.i = 0;
      do {
        plVar3 = (long *)(**(code **)(*(long *)this + 0xa8))(this,iVar1 + -2);
        uVar2 = (**(code **)(*plVar3 + 0x80))(plVar3);
        QVar4.i = QVar4.i | uVar2;
        iVar1 = iVar1 + -1;
      } while (1 < iVar1);
    }
  }
  return (QFlagsStorageHelper<QSizePolicy::ControlType,_4>)
         (QFlagsStorageHelper<QSizePolicy::ControlType,_4>)QVar4.i;
}

Assistant:

QSizePolicy::ControlTypes QLayout::controlTypes() const
{
    if (count() == 0)
        return QSizePolicy::DefaultType;
    QSizePolicy::ControlTypes types;
    for (int i = count() - 1; i >= 0; --i)
        types |= itemAt(i)->controlTypes();
    return types;
}